

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

int Sfm_TimTrace(Sfm_Tim_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes;
  int Delay;
  int i;
  Abc_Obj_t *pObj;
  Sfm_Tim_t *p_local;
  
  vNodes._0_4_ = 0;
  p_00 = Abc_NtkDfs(p->pNtk,1);
  for (vNodes._4_4_ = 0; iVar1 = Vec_PtrSize(p_00), vNodes._4_4_ < iVar1;
      vNodes._4_4_ = vNodes._4_4_ + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,vNodes._4_4_);
    Sfm_TimNodeArrival(p,pAVar2);
  }
  for (vNodes._4_4_ = 0; iVar1 = Abc_NtkCoNum(p->pNtk), vNodes._4_4_ < iVar1;
      vNodes._4_4_ = vNodes._4_4_ + 1) {
    pAVar2 = Abc_NtkCo(p->pNtk,vNodes._4_4_);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    iVar1 = Sfm_TimArrMax(p,pAVar2);
    vNodes._0_4_ = Abc_MaxInt((int)vNodes,iVar1);
  }
  iVar1 = Abc_NtkObjNumMax(p->pNtk);
  Vec_IntFill(&p->vTimReqs,iVar1 << 1,1000000000);
  for (vNodes._4_4_ = 0; iVar1 = Abc_NtkCoNum(p->pNtk), vNodes._4_4_ < iVar1;
      vNodes._4_4_ = vNodes._4_4_ + 1) {
    pAVar2 = Abc_NtkCo(p->pNtk,vNodes._4_4_);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    Sfm_TimSetReq(p,pAVar2,(int)vNodes);
  }
  vNodes._4_4_ = Vec_PtrSize(p_00);
  while (vNodes._4_4_ = vNodes._4_4_ + -1, -1 < vNodes._4_4_) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,vNodes._4_4_);
    Sfm_TimNodeRequired(p,pAVar2);
  }
  Vec_PtrFree(p_00);
  return (int)vNodes;
}

Assistant:

int Sfm_TimTrace( Sfm_Tim_t * p )
{
    Abc_Obj_t * pObj; int i, Delay = 0;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( p->pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeArrival( p, pObj );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Delay = Abc_MaxInt( Delay, Sfm_TimArrMax(p, Abc_ObjFanin0(pObj)) );
    Vec_IntFill( &p->vTimReqs, 2*Abc_NtkObjNumMax(p->pNtk), ABC_INFINITY );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Sfm_TimSetReq( p, Abc_ObjFanin0(pObj), Delay );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeRequired( p, pObj );
    Vec_PtrFree( vNodes );
    return Delay;
}